

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

void buffer_register_mmt_write(mmt_write *w)

{
  cpu_mapping *mapping;
  int iVar1;
  char *__format;
  
  if (((max_id == 0xffffffff) || (max_id < w->id)) ||
     (mapping = cpu_mappings[w->id], mapping == (cpu_mapping *)0x0)) {
    __format = "ERROR: buffer %d does not exist\n";
LAB_00245377:
    fprintf(_stdout,__format);
  }
  else {
    if ((ulong)(w->offset + (uint)w->len) <= mapping->length) {
      if (mapping->data != (uint8_t *)0x0) {
        memcpy(mapping->data + w->offset,w + 1,(ulong)w->len);
        if (mapping->object == (gpu_object *)0x0) {
LAB_00245320:
          buffer_decode_register_write(mapping,w->offset,(uint)w->len);
          return;
        }
        iVar1 = regions_add_range(&mapping->object->written_regions,
                                  w->offset + (int)mapping->object_offset,(uint)w->len);
        if (iVar1 != 0) goto LAB_00245320;
        goto LAB_00245392;
      }
      __format = "ERROR: buffer %d does not have data(?)\n";
      goto LAB_00245377;
    }
    fprintf(_stdout,"ERROR: buffer %d is too small (%ld) for write starting at %d and length %d\n",
            (ulong)mapping->id);
  }
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
LAB_00245392:
  demmt_abort();
}

Assistant:

void buffer_register_mmt_write(struct mmt_write *w)
{
	uint32_t id = w->id;

	struct cpu_mapping *mapping = get_cpu_mapping(id);
	if (mapping == NULL)
	{
		mmt_error("buffer %d does not exist\n", id);
		demmt_abort();
	}

	if (mapping->length < w->offset + w->len)
	{
		mmt_error("buffer %d is too small (%" PRId64 ") for write starting at %d and length %d\n",
				mapping->id, mapping->length, w->offset, w->len);
		demmt_abort();
	}

	if (mapping->data == NULL)
	{
		mmt_error("buffer %d does not have data(?)\n", id);
		demmt_abort();
	}
	memcpy(mapping->data + w->offset, w->data, w->len);

	if (mapping->object)
		if (!regions_add_range(&mapping->object->written_regions, w->offset + mapping->object_offset, w->len))
			demmt_abort();

	buffer_decode_register_write(mapping, w->offset, w->len);
}